

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.h
# Opt level: O1

size_t __thiscall mocker::ir::Stats::countInsts<mocker::ir::Store>(Stats *this)

{
  size_t sVar1;
  _Hash_node_base *p_Var2;
  size_t sVar3;
  anon_class_1_0_00000001 local_21;
  
  p_Var2 = (this->module->funcs)._M_h._M_before_begin._M_nxt;
  if (p_Var2 == (_Hash_node_base *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      sVar1 = countInstsIf<mocker::ir::Stats::countInsts<mocker::ir::Store>()const::_lambda(std::shared_ptr<mocker::ir::IRInst>const&)_1_>
                        (this,&local_21,(FunctionModule *)(p_Var2 + 5));
      sVar3 = sVar3 + sVar1;
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return sVar3;
}

Assistant:

std::size_t countInstsIf(const Condition &condition) const {
    std::size_t res = 0;
    for (auto &f : module.getFuncs())
      res += countInstsIf(condition, f.second);
    return res;
  }